

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O1

void __thiscall EDColor::validateEdgeSegments(EDColor *this)

{
  int *piVar1;
  int iVar2;
  double *pdVar3;
  void *__s;
  uchar *puVar4;
  pointer *ppPVar5;
  pointer pvVar6;
  int i;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  uchar *puVar14;
  uchar *puVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uchar *puVar21;
  uchar *puVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  short *psVar26;
  uchar *puVar27;
  Mat gradImage;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  void *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  _InputArray local_a8;
  Mat local_90 [96];
  
  pdVar3 = (double *)operator_new__(0x40000);
  this->H = pdVar3;
  memset(pdVar3,0,0x40000);
  memset(this->edgeImg,0,(long)this->height * (long)this->width);
  memset(this->gradImg,0,(long)this->height * (long)this->width * 2);
  __s = operator_new__(0x20000);
  memset(__s,0,0x20000);
  iVar10 = this->height;
  if (2 < iVar10) {
    iVar2 = this->width;
    lVar7 = (long)iVar2;
    puVar27 = this->smooth_L;
    puVar22 = this->smooth_a;
    puVar11 = this->smooth_b;
    psVar26 = this->gradImg + lVar7 + 1;
    puVar14 = puVar27 + lVar7 + 2;
    puVar21 = puVar22 + lVar7 + 2;
    puVar4 = puVar11 + lVar7 + 2;
    puVar13 = puVar11 + lVar7 * 2 + 2;
    puVar11 = puVar11 + 2;
    puVar12 = puVar22 + lVar7 * 2 + 2;
    puVar22 = puVar22 + 2;
    puVar15 = puVar27 + lVar7 * 2 + 2;
    puVar27 = puVar27 + 2;
    uVar18 = 1;
    do {
      if (2 < iVar2) {
        lVar16 = 0;
        do {
          iVar23 = ((uint)puVar14[lVar16] + ((uint)puVar27[lVar16] - (uint)puVar15[lVar16 + -2]) +
                   ((uint)puVar15[lVar16] - (uint)puVar27[lVar16 + -2])) -
                   (uint)puVar14[lVar16 + -2];
          iVar9 = -iVar23;
          if (0 < iVar23) {
            iVar9 = iVar23;
          }
          iVar17 = ((uint)puVar15[lVar16 + -1] +
                   ((uint)puVar15[lVar16] - (uint)puVar27[lVar16 + -2])) -
                   ((uint)puVar27[lVar16 + -1] +
                   ((uint)puVar27[lVar16] - (uint)puVar15[lVar16 + -2]));
          iVar23 = -iVar17;
          if (0 < iVar17) {
            iVar23 = iVar17;
          }
          iVar24 = ((uint)puVar21[lVar16] + ((uint)puVar22[lVar16] - (uint)puVar12[lVar16 + -2]) +
                   ((uint)puVar12[lVar16] - (uint)puVar22[lVar16 + -2])) -
                   (uint)puVar21[lVar16 + -2];
          iVar17 = -iVar24;
          if (0 < iVar24) {
            iVar17 = iVar24;
          }
          iVar25 = ((uint)puVar12[lVar16 + -1] +
                   ((uint)puVar12[lVar16] - (uint)puVar22[lVar16 + -2])) -
                   ((uint)puVar22[lVar16 + -1] +
                   ((uint)puVar22[lVar16] - (uint)puVar12[lVar16 + -2]));
          iVar24 = -iVar25;
          if (0 < iVar25) {
            iVar24 = iVar25;
          }
          iVar19 = ((uint)puVar4[lVar16] + ((uint)puVar11[lVar16] - (uint)puVar13[lVar16 + -2]) +
                   ((uint)puVar13[lVar16] - (uint)puVar11[lVar16 + -2])) - (uint)puVar4[lVar16 + -2]
          ;
          iVar25 = -iVar19;
          if (0 < iVar19) {
            iVar25 = iVar19;
          }
          iVar20 = ((uint)puVar13[lVar16 + -1] +
                   ((uint)puVar13[lVar16] - (uint)puVar11[lVar16 + -2])) -
                   ((uint)puVar11[lVar16 + -1] +
                   ((uint)puVar11[lVar16] - (uint)puVar13[lVar16 + -2]));
          iVar19 = -iVar20;
          if (0 < iVar20) {
            iVar19 = iVar20;
          }
          uVar8 = (ulong)(iVar19 + iVar24 + iVar17 + iVar23 + iVar9 + iVar25 + 2) / 3;
          psVar26[lVar16] = (short)uVar8;
          piVar1 = (int *)((long)__s + uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          lVar16 = lVar16 + 1;
        } while ((ulong)(iVar2 - 1) - 1 != lVar16);
      }
      uVar18 = uVar18 + 1;
      psVar26 = psVar26 + lVar7;
      puVar14 = puVar14 + lVar7;
      puVar21 = puVar21 + lVar7;
      puVar4 = puVar4 + lVar7;
      puVar27 = puVar27 + lVar7;
      puVar22 = puVar22 + lVar7;
      puVar11 = puVar11 + lVar7;
      puVar13 = puVar13 + lVar7;
      puVar12 = puVar12 + lVar7;
      puVar15 = puVar15 + lVar7;
    } while (uVar18 != iVar10 - 1);
  }
  cv::Mat::Mat(local_90,iVar10,this->width,3,this->gradImg,0);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"newGrad.pgm","");
  local_a8.sz.width = 0;
  local_a8.sz.height = 0;
  local_a8.flags = 0x1010000;
  local_b8 = 0;
  local_c8 = (void *)0x0;
  uStack_c0 = 0;
  local_a8.obj = local_90;
  cv::imwrite((string *)local_e8,&local_a8,(vector *)&local_c8);
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  iVar10 = this->width;
  iVar2 = this->height;
  iVar9 = *(int *)((long)__s + 0x1fffc);
  uVar18 = 0x8000;
  do {
    iVar9 = iVar9 + *(int *)((long)__s + uVar18 * 4 + -8);
    *(int *)((long)__s + uVar18 * 4 + -8) = iVar9;
    uVar18 = uVar18 - 1;
  } while (1 < uVar18);
  pdVar3 = this->H;
  lVar7 = 0;
  do {
    pdVar3[lVar7] = (double)*(int *)((long)__s + lVar7 * 4) / (double)((iVar2 + -2) * (iVar10 + -2))
    ;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x8000);
  this->np = 0;
  pvVar6 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->segments).
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6;
  if (lVar7 != 0) {
    iVar10 = this->np;
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    ppPVar5 = (pointer *)
              ((long)&(pvVar6->
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                      _M_impl.super__Vector_impl_data + 8);
    do {
      iVar2 = (int)((ulong)((long)*ppPVar5 - (long)((_Vector_impl_data *)(ppPVar5 + -1))->_M_start)
                   >> 3);
      iVar10 = iVar10 + ((iVar2 + -1) * iVar2) / 2;
      ppPVar5 = ppPVar5 + 3;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    this->np = iVar10;
  }
  pvVar6 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->segments).
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar6) {
    lVar7 = 8;
    uVar18 = 0;
    do {
      testSegment(this,(int)uVar18,0,
                  (int)((ulong)(*(long *)((long)&(pvVar6->
                                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar7)
                               - *(long *)((long)pvVar6 + lVar7 + -8)) >> 3) + -1);
      uVar18 = uVar18 + 1;
      pvVar6 = (this->segments).
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->segments).
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
              -0x5555555555555555;
      lVar7 = lVar7 + 0x18;
    } while (uVar18 <= uVar8 && uVar8 - uVar18 != 0);
  }
  if (this->H != (double *)0x0) {
    operator_delete__(this->H);
  }
  operator_delete__(__s);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void EDColor::validateEdgeSegments()
{
	int maxGradValue = MAX_GRAD_VALUE;
	H = new double[maxGradValue];
	memset(H, 0, sizeof(double)*maxGradValue);

	memset(edgeImg, 0, width*height); // clear edge image
	
	// Compute the gradient
	memset(gradImg, 0, sizeof(short)*width*height); // reset gradient Image pixels to zero

	int *grads = new int[maxGradValue];
	memset(grads, 0, sizeof(int)*maxGradValue);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Gradient for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = abs(com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]));
			int gyCh1 = abs(com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]));
			int ch1Grad = gxCh1 + gyCh1;

			// Gradient for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = abs(com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]));
			int gyCh2 = abs(com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]));
			int ch2Grad = gxCh2 + gyCh2;

			// Gradient for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = abs(com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]));
			int gyCh3 = abs(com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]));
			int ch3Grad = gxCh3 + gyCh3;

			// Take average
			int grad = (ch1Grad + ch2Grad + ch3Grad + 2) / 3;

			gradImg[i*width + j] = grad;
			grads[grad]++;
		} //end-for
	} //end-for

	Mat gradImage = Mat(height, width, CV_16SC1, gradImg);
	imwrite("newGrad.pgm", gradImage);

	// Compute probability function H
	int size = (width - 2)*(height - 2);
	//  size -= grads[0];
	
	for (int i = maxGradValue - 1; i>0; i--) 
		grads[i - 1] += grads[i];
	
	for (int i = 0; i<maxGradValue; i++) 
		H[i] = (double)grads[i] / ((double)size);

	// Compute np: # of segment pieces
	np = 0;
	for (int i = 0; i<segments.size(); i++) {
		int len = (int)segments[i].size();
		np += (len*(len - 1)) / 2;
	} //end-for

	// Validate segments
	for (int i = 0; i< segments.size(); i++) {
		testSegment(i, 0, (int)segments[i].size() - 1);
	} //end-for

	// clear space
	delete[] H;
	delete[] grads;
}